

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abc.c
# Opt level: O0

int Abc_CommandPrintDsd(Abc_Frame_t *pAbc,int argc,char **argv)

{
  Hop_Man_t *p;
  bool bVar1;
  bool bVar2;
  bool bVar3;
  int iVar4;
  Abc_Ntk_t *pNtk_00;
  Abc_Obj_t *pAVar5;
  Vec_Int_t *vTruth;
  Hop_Obj_t *pRoot;
  word *pInit;
  word wVar6;
  char *pcVar7;
  word *pTruthW;
  uint *pTruth;
  Vec_Int_t *vMemory;
  Abc_Obj_t *pObj;
  int fPrintDec;
  int fProfile;
  int nCofLevel;
  int fCofactor;
  int c;
  Abc_Ntk_t *pNtk;
  char **argv_local;
  int argc_local;
  Abc_Frame_t *pAbc_local;
  
  pNtk_00 = Abc_FrameReadNtk(pAbc);
  fPrintDec = 1;
  bVar3 = false;
  bVar2 = false;
  bVar1 = false;
  Extra_UtilGetoptReset();
  do {
    iVar4 = Extra_UtilGetopt(argc,argv,"Npcdh");
    if (iVar4 == -1) {
      if (pNtk_00 == (Abc_Ntk_t *)0x0) {
        Abc_Print(-1,"Empty network.\n");
        return 1;
      }
      iVar4 = Abc_NtkIsLogic(pNtk_00);
      if (iVar4 == 0) {
        Abc_Print(-1,"Currently works only for logic networks.\n");
        return 1;
      }
      Abc_NtkToAig(pNtk_00);
      pAVar5 = Abc_NtkPo(pNtk_00,0);
      pAVar5 = Abc_ObjFanin0(pAVar5);
      iVar4 = Abc_ObjIsNode(pAVar5);
      if (iVar4 == 0) {
        Abc_Print(-1,"The fanin of the first PO node does not have a logic function.\n");
        return 1;
      }
      iVar4 = Abc_ObjFaninNum(pAVar5);
      if (0x10 < iVar4) {
        Abc_Print(-1,"Currently works only for up to 16 inputs.\n");
        return 1;
      }
      vTruth = Vec_IntAlloc(0);
      p = (Hop_Man_t *)pNtk_00->pManFunc;
      pRoot = Hop_Regular((Hop_Obj_t *)(pAVar5->field_5).pData);
      iVar4 = Abc_ObjFaninNum(pAVar5);
      pInit = (word *)Hop_ManConvertAigToTruth(p,pRoot,iVar4,vTruth,0);
      iVar4 = Hop_IsComplement((Hop_Obj_t *)(pAVar5->field_5).pData);
      if (iVar4 != 0) {
        iVar4 = Abc_ObjFaninNum(pAVar5);
        Extra_TruthNot((uint *)pInit,(uint *)pInit,iVar4);
      }
      if (bVar1) {
        iVar4 = Abc_ObjFaninNum(pAVar5);
        if (iVar4 < 6) {
          wVar6 = *pInit;
          iVar4 = Abc_ObjFaninNum(pAVar5);
          wVar6 = Abc_Tt6Stretch(wVar6,iVar4);
          *pInit = wVar6;
        }
        iVar4 = Abc_ObjFaninNum(pAVar5);
        Dau_DecTrySets(pInit,iVar4,1);
      }
      if (bVar2) {
        iVar4 = Abc_ObjFaninNum(pAVar5);
        Kit_TruthPrintProfile((uint *)pInit,iVar4);
      }
      else if (bVar3) {
        iVar4 = Abc_ObjFaninNum(pAVar5);
        Kit_DsdPrintCofactors((uint *)pInit,iVar4,fPrintDec,1);
      }
      else {
        iVar4 = Abc_ObjFaninNum(pAVar5);
        Kit_DsdTest((uint *)pInit,iVar4);
      }
      Vec_IntFree(vTruth);
      return 0;
    }
    switch(iVar4) {
    case 0x4e:
      if (argc <= globalUtilOptind) {
        Abc_Print(-1,"Command line switch \"-N\" should be followed by an integer.\n");
        goto LAB_00263842;
      }
      fPrintDec = atoi(argv[globalUtilOptind]);
      globalUtilOptind = globalUtilOptind + 1;
      if (fPrintDec < 0) {
LAB_00263842:
        Abc_Print(-2,"usage: print_dsd [-pcdh] [-N <num>]\n");
        Abc_Print(-2,
                  "\t           print DSD formula for a single-output function with less than 16 variables\n"
                 );
        pcVar7 = "no";
        if (bVar2) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,"\t-p       : toggle printing profile [default = %s]\n",pcVar7);
        pcVar7 = "no";
        if (bVar3) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,"\t-c       : toggle recursive cofactoring [default = %s]\n",pcVar7);
        pcVar7 = "no";
        if (bVar1) {
          pcVar7 = "yes";
        }
        Abc_Print(-2,"\t-d       : toggle printing decompositions [default = %s]\n",pcVar7);
        Abc_Print(-2,"\t-N <num> : the number of levels to cofactor [default = %d]\n",
                  (ulong)(uint)fPrintDec);
        Abc_Print(-2,"\t-h       : print the command usage\n");
        return 1;
      }
      break;
    default:
      goto LAB_00263842;
    case 99:
      bVar3 = (bool)(bVar3 ^ 1);
      break;
    case 100:
      bVar1 = (bool)(bVar1 ^ 1);
      break;
    case 0x68:
      goto LAB_00263842;
    case 0x70:
      bVar2 = (bool)(bVar2 ^ 1);
    }
  } while( true );
}

Assistant:

int Abc_CommandPrintDsd( Abc_Frame_t * pAbc, int argc, char ** argv )
{
    Abc_Ntk_t * pNtk = Abc_FrameReadNtk(pAbc);
    int c;
    int fCofactor;
    int nCofLevel;
    int fProfile;
    int fPrintDec;

    extern void Kit_DsdTest( unsigned * pTruth, int nVars );
    extern void Kit_DsdPrintCofactors( unsigned * pTruth, int nVars, int nCofLevel, int fVerbose );
    extern void Dau_DecTrySets( word * p, int nVars, int fVerbose );

    // set defaults
    nCofLevel = 1;
    fCofactor = 0;
    fProfile  = 0;
    fPrintDec = 0;
    Extra_UtilGetoptReset();
    while ( ( c = Extra_UtilGetopt( argc, argv, "Npcdh" ) ) != EOF )
    {
        switch ( c )
        {
        case 'N':
            if ( globalUtilOptind >= argc )
            {
                Abc_Print( -1, "Command line switch \"-N\" should be followed by an integer.\n" );
                goto usage;
            }
            nCofLevel = atoi(argv[globalUtilOptind]);
            globalUtilOptind++;
            if ( nCofLevel < 0 )
                goto usage;
            break;
        case 'p':
            fProfile ^= 1;
            break;
        case 'c':
            fCofactor ^= 1;
            break;
        case 'd':
            fPrintDec ^= 1;
            break;
        case 'h':
            goto usage;
        default:
            goto usage;
        }
    }

    if ( pNtk == NULL )
    {
        Abc_Print( -1, "Empty network.\n" );
        return 1;
    }
    // get the truth table of the first output
    if ( !Abc_NtkIsLogic(pNtk) )
    {
        Abc_Print( -1, "Currently works only for logic networks.\n" );
        return 1;
    }
    Abc_NtkToAig( pNtk );
    // convert it to truth table
    {
        Abc_Obj_t * pObj = Abc_ObjFanin0( Abc_NtkPo(pNtk, 0) );
        Vec_Int_t * vMemory;
        unsigned * pTruth;
        if ( !Abc_ObjIsNode(pObj) )
        {
            Abc_Print( -1, "The fanin of the first PO node does not have a logic function.\n" );
            return 1;
        }
        if ( Abc_ObjFaninNum(pObj) > 16 )
        {
            Abc_Print( -1, "Currently works only for up to 16 inputs.\n" );
            return 1;
        }
        vMemory = Vec_IntAlloc(0);
        pTruth = Hop_ManConvertAigToTruth( (Hop_Man_t *)pNtk->pManFunc, Hop_Regular((Hop_Obj_t *)pObj->pData), Abc_ObjFaninNum(pObj), vMemory, 0 );
        if ( Hop_IsComplement((Hop_Obj_t *)pObj->pData) )
            Extra_TruthNot( pTruth, pTruth, Abc_ObjFaninNum(pObj) );
//        Extra_PrintBinary( stdout, pTruth, 1 << Abc_ObjFaninNum(pObj) );
//        Abc_Print( -1, "\n" );
        if ( fPrintDec )//&&Abc_ObjFaninNum(pObj) <= 6 )
        {
            word * pTruthW = (word *)pTruth;
            if ( Abc_ObjFaninNum(pObj) < 6 )
                pTruthW[0] = Abc_Tt6Stretch( pTruthW[0], Abc_ObjFaninNum(pObj) );
            Dau_DecTrySets( (word *)pTruth, Abc_ObjFaninNum(pObj), 1 );
        }
        if ( fProfile )
            Kit_TruthPrintProfile( pTruth, Abc_ObjFaninNum(pObj) );
        else if ( fCofactor )
            Kit_DsdPrintCofactors( pTruth, Abc_ObjFaninNum(pObj), nCofLevel, 1 );
        else
            Kit_DsdTest( pTruth, Abc_ObjFaninNum(pObj) );
        Vec_IntFree( vMemory );
    }
    return 0;

usage:
    Abc_Print( -2, "usage: print_dsd [-pcdh] [-N <num>]\n" );
    Abc_Print( -2, "\t           print DSD formula for a single-output function with less than 16 variables\n" );
    Abc_Print( -2, "\t-p       : toggle printing profile [default = %s]\n", fProfile? "yes": "no" );
    Abc_Print( -2, "\t-c       : toggle recursive cofactoring [default = %s]\n", fCofactor? "yes": "no" );
    Abc_Print( -2, "\t-d       : toggle printing decompositions [default = %s]\n", fPrintDec? "yes": "no" );
    Abc_Print( -2, "\t-N <num> : the number of levels to cofactor [default = %d]\n", nCofLevel );
    Abc_Print( -2, "\t-h       : print the command usage\n");
    return 1;
}